

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

int __thiscall lscpp::comm_logger::open(comm_logger *this,char *__file,int __oflag,...)

{
  size_t sVar1;
  int iVar2;
  ostream *poVar3;
  FILE *pFVar4;
  string local_1e0 [32];
  string name;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  sVar1 = this->msg_id_;
  std::__cxx11::string::string(local_1e0,(string *)__file);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,".lscpp/");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
  poVar3 = std::operator<<(poVar3,0x30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)sVar1);
  std::operator<<(poVar3,local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::__cxx11::string::~string(local_1e0);
  pFVar4 = fopen(name._M_dataplus._M_p,"w");
  this->cur_file_ = (FILE *)pFVar4;
  this->file_open_ = true;
  this->msg_id_ = this->msg_id_ + 1;
  iVar2 = std::__cxx11::string::~string((string *)&name);
  return iVar2;
}

Assistant:

void comm_logger::open(std::string suffix) {
  auto name = filename(msg_id_, suffix);
  cur_file_ = std::fopen(name.c_str(), "w");
  file_open_ = true;
  msg_id_++;
}